

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel.cpp
# Opt level: O0

void ncnn::to_gray(Mat *m,uchar *gray,int stride)

{
  int *piVar1;
  int in_EDX;
  undefined1 *in_RSI;
  Mat *in_RDI;
  int remain;
  int y;
  float *ptr;
  int wgap;
  int h;
  int w;
  int local_3c [3];
  int local_30;
  int local_2c;
  float *local_28;
  int local_20;
  int local_1c;
  int local_18;
  undefined1 *local_10;
  
  local_18 = in_RDI->w;
  local_1c = in_RDI->h;
  local_20 = in_EDX - local_18;
  if (local_20 == 0) {
    local_18 = local_18 * local_1c;
    local_1c = 1;
  }
  local_10 = in_RSI;
  local_28 = Mat::operator_cast_to_float_(in_RDI);
  for (local_2c = 0; local_2c < local_1c; local_2c = local_2c + 1) {
    for (local_30 = local_18; 0 < local_30; local_30 = local_30 + -1) {
      local_3c[2] = (int)*local_28;
      local_3c[1] = 0;
      piVar1 = std::max<int>(local_3c + 2,local_3c + 1);
      local_3c[0] = 0xff;
      piVar1 = std::min<int>(piVar1,local_3c);
      *local_10 = (char)*piVar1;
      local_10 = local_10 + 1;
      local_28 = local_28 + 1;
    }
    local_10 = local_10 + local_20;
  }
  return;
}

Assistant:

static void to_gray(const Mat& m, unsigned char* gray, int stride)
{
    int w = m.w;
    int h = m.h;

    const int wgap = stride - w;
    if (wgap == 0)
    {
        w = w * h;
        h = 1;
    }

    const float* ptr = m;

    for (int y=0; y<h; y++)
    {
#define SATURATE_CAST_UCHAR(X) (unsigned char)::std::min(::std::max((int)(X), 0), 255);

        int remain = w;

        for (; remain>0; remain--)
        {
            *gray = SATURATE_CAST_UCHAR(*ptr);

            gray++;
            ptr++;
        }

#undef SATURATE_CAST_UCHAR
        gray += wgap;
    }
}